

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

int32_t icu_63::ICU_Utility::skipWhitespace(UnicodeString *str,int32_t *pos,UBool advance)

{
  ushort uVar1;
  int32_t iVar2;
  UChar *pUVar3;
  int iVar4;
  char16_t *pcVar5;
  
  uVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar5 = (str->fUnion).fFields.fArray;
    }
    else {
      pcVar5 = (char16_t *)((long)&str->fUnion + 2);
    }
  }
  else {
    pcVar5 = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    iVar4 = (str->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)(short)uVar1 >> 5;
  }
  pUVar3 = PatternProps::skipWhiteSpace(pcVar5 + *pos,iVar4 - *pos);
  iVar2 = (int32_t)((ulong)((long)pUVar3 - (long)pcVar5) >> 1);
  if (advance != '\0') {
    *pos = iVar2;
  }
  return iVar2;
}

Assistant:

int32_t ICU_Utility::skipWhitespace(const UnicodeString& str, int32_t& pos,
                                    UBool advance) {
    int32_t p = pos;
    const UChar* s = str.getBuffer();
    p = (int32_t)(PatternProps::skipWhiteSpace(s + p, str.length() - p) - s);
    if (advance) {
        pos = p;
    }
    return p;
}